

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void recomputeColumnsNotIndexed(Index *pIdx)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (ulong)pIdx->nColumn;
  uVar3 = 0;
  while (0 < (long)uVar2) {
    lVar1 = uVar2 - 1;
    uVar2 = uVar2 - 1;
    uVar4 = 1L << ((byte)pIdx->aiColumn[lVar1] & 0x3f);
    if (0x3e < (ushort)pIdx->aiColumn[lVar1]) {
      uVar4 = 0;
    }
    uVar3 = uVar3 | uVar4;
  }
  pIdx->colNotIdxed = ~uVar3;
  return;
}

Assistant:

static void recomputeColumnsNotIndexed(Index *pIdx){
  Bitmask m = 0;
  int j;
  for(j=pIdx->nColumn-1; j>=0; j--){
    int x = pIdx->aiColumn[j];
    if( x>=0 ){
      testcase( x==BMS-1 );
      testcase( x==BMS-2 );
      if( x<BMS-1 ) m |= MASKBIT(x);
    }
  }
  pIdx->colNotIdxed = ~m;
  assert( (pIdx->colNotIdxed>>63)==1 );
}